

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCec.c
# Opt level: O3

Aig_Man_t * Cec_SignalCorrespondence(Aig_Man_t *pAig,int nConfs,int fUseCSat)

{
  Gia_Man_t *pAig_00;
  Aig_Man_t *pAVar1;
  Cec_ParCor_t *pCorPars;
  Cec_ParCor_t CorPars;
  Cec_ParCor_t CStack_78;
  
  Cec_ManCorSetDefaultParams(&CStack_78);
  CStack_78.nBTLimit = nConfs;
  CStack_78.fUseCSat = fUseCSat;
  pAig_00 = Gia_ManFromAigSimple(pAig);
  Cec_ManLSCorrespondenceClasses(pAig_00,&CStack_78);
  Gia_ManReprToAigRepr(pAig,pAig_00);
  Gia_ManStop(pAig_00);
  pAVar1 = Aig_ManDupSimple(pAig);
  return pAVar1;
}

Assistant:

Aig_Man_t * Cec_SignalCorrespondence( Aig_Man_t * pAig, int nConfs, int fUseCSat )
{
    Gia_Man_t * pGia;
    Cec_ParCor_t CorPars, * pCorPars = &CorPars;
    Cec_ManCorSetDefaultParams( pCorPars );
    pCorPars->fUseCSat  = fUseCSat;
    pCorPars->nBTLimit  = nConfs;
    pGia = Gia_ManFromAigSimple( pAig );
    Cec_ManLSCorrespondenceClasses( pGia, pCorPars );
    Gia_ManReprToAigRepr( pAig, pGia );
    Gia_ManStop( pGia );
    return Aig_ManDupSimple( pAig );
}